

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::InvalidateFixedField<int>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,int propertyKey,
          DictionaryPropertyDescriptor<unsigned_short> *descriptor)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar3;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  DynamicObject *pDVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  ThreadContext *this_01;
  PropertyId propertyId;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  int propertyKey_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(&this->super_DynamicTypeHandler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xa74,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->singletonInstance);
  if (*ppRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&this->singletonInstance);
    pDVar4 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
    if (pDVar4 != instance) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xa77,"(this->singletonInstance->Get() == instance)",
                                  "this->singletonInstance->Get() == instance");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    DictionaryPropertyDescriptor<unsigned_short>::SetIsFixed(descriptor,false);
    bVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetUsedAsFixed(descriptor);
    if (bVar2) {
      pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(pSVar6,propertyKey);
      pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      this_01 = ScriptContext::GetThreadContext(pSVar6);
      ThreadContext::InvalidatePropertyGuards(this_01,propertyId_00);
      DictionaryPropertyDescriptor<unsigned_short>::SetUsedAsFixed(descriptor,false);
    }
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::InvalidateFixedField(DynamicObject* instance, TPropertyKey propertyKey, DictionaryPropertyDescriptor<T>* descriptor)
    {
        // DictionaryTypeHandlers are never shared, but if they were we would need to invalidate even if
        // there wasn't a singleton instance.  See SimpleDictionaryTypeHandler::InvalidateFixedFields.
        Assert(!GetIsOrMayBecomeShared());
        if (this->singletonInstance != nullptr)
        {
            Assert(this->singletonInstance->Get() == instance);

            // Even if we wrote a new value into this property (overwriting a previously fixed one), we don't
            // consider the new one fixed. This also means that it's ok to populate the inline caches for
            // this property from now on.
            descriptor->SetIsFixed(false);

            if (descriptor->GetUsedAsFixed())
            {
                // Invalidate any JIT-ed code that hard coded this method. No need to invalidate
                // any store field inline caches, because they have never been populated.
                PropertyId propertyId = TMapKey_GetPropertyId(instance->GetScriptContext(), propertyKey);
                instance->GetScriptContext()->GetThreadContext()->InvalidatePropertyGuards(propertyId);
                descriptor->SetUsedAsFixed(false);
            }
        }
    }